

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O3

bool __thiscall kws::Parser::InitIndentation(Parser *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer ppVar4;
  pointer pcVar5;
  string *psVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pIVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  size_t sVar16;
  uint uVar17;
  pointer ppVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  char cVar22;
  vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_> *this_00;
  _Alloc_hider _Var23;
  size_t *psVar24;
  pointer __args;
  IndentPosition ind;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacevec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> namespacePos;
  size_t posNamespaceComments;
  IndentPosition tempind;
  IndentPosition tempind_1;
  value_type local_298;
  int local_264;
  ulong local_260;
  size_t *local_258;
  iterator iStack_250;
  unsigned_long *local_248;
  size_t *local_238;
  iterator iStack_230;
  unsigned_long *local_228;
  value_type local_220;
  value_type local_1f0;
  value_type local_1c0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_IdentPositionVector;
  std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::clear(this_00)
  ;
  local_258 = (size_t *)0x0;
  iStack_250._M_current = (size_t *)0x0;
  local_248 = (unsigned_long *)0x0;
  psVar1 = &this->m_BufferNoComment;
  for (uVar8 = std::__cxx11::string::find((char *)psVar1,0x176519,0); uVar8 != 0xffffffffffffffff;
      uVar8 = std::__cxx11::string::find((char *)psVar1,0x176519,uVar8 + 1)) {
    uVar9 = std::__cxx11::string::find((char *)psVar1,0x168cee,uVar8);
    if ((uVar9 != 0xffffffffffffffff) &&
       (uVar10 = std::__cxx11::string::find((char *)psVar1,0x175d46,uVar8), uVar9 < uVar10)) {
      local_298.position = GetPositionWithComments(this,uVar9);
      local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
      local_298.name._M_string_length = 0;
      local_298.name.field_2._M_local_buf[0] = '\0';
      local_298.current = 0;
      local_298.after = 0;
      local_220.position = local_298.position;
      if (iStack_250._M_current == local_248) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_258,iStack_250,
                   &local_220.position);
      }
      else {
        *iStack_250._M_current = local_298.position;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_298);
      sVar12 = local_220.position;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      local_298.position = FindClosingChar(this,'{','}',sVar12,false,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (iStack_250._M_current == local_248) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_258,iStack_250,
                   &local_298.position);
      }
      else {
        *iStack_250._M_current = local_298.position;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
        operator_delete(local_298.name._M_dataplus._M_p);
      }
    }
  }
  local_238 = (size_t *)0x0;
  iStack_230._M_current = (size_t *)0x0;
  local_228 = (unsigned_long *)0x0;
  __args = (this->m_IdentPositionVector).
           super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar11 = (this->m_IdentPositionVector).
            super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__args != pIVar11) {
    do {
      if (iStack_230._M_current == local_228) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_238,iStack_230,
                   &__args->position);
        pIVar11 = (this->m_IdentPositionVector).
                  super__Vector_base<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iStack_230._M_current = __args->position;
        iStack_230._M_current = iStack_230._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != pIVar11);
  }
  while( true ) {
    cVar22 = (char)psVar1;
    sVar12 = std::__cxx11::string::find(cVar22,0x7b);
    if (sVar12 == 0xffffffffffffffff) break;
    sVar13 = GetPositionWithComments(this,sVar12);
    ppVar18 = (this->m_IfElseEndifList).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->m_IfElseEndifList).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar18 == ppVar4) goto LAB_0014ef40;
    while ((sVar13 <= ppVar18->first || (ppVar18->second <= sVar13))) {
      ppVar18 = ppVar18 + 1;
      if (ppVar18 == ppVar4) goto joined_r0x0014ef34;
    }
  }
LAB_0014f3cb:
  lVar15 = std::__cxx11::string::find((char *)psVar1,0x176523,0);
  if (lVar15 != -1) {
    do {
      uVar8 = lVar15 + 5;
      pcVar5 = (this->m_BufferNoComment)._M_dataplus._M_p;
      uVar9 = (this->m_BufferNoComment)._M_string_length;
      uVar10 = uVar8;
      if (uVar8 < uVar9) {
        do {
          uVar19 = (ulong)(byte)pcVar5[uVar8];
          uVar10 = uVar8;
          if ((0x20 < uVar19) || ((0x100002400U >> (uVar19 & 0x3f) & 1) == 0)) break;
          uVar8 = uVar8 + 1;
          uVar10 = uVar9;
        } while (uVar9 != uVar8);
      }
      if ((pcVar5[uVar10] == '(') &&
         (sVar12 = std::__cxx11::string::find(cVar22,0x7b), sVar12 != 0xffffffffffffffff)) {
        sVar12 = GetPositionWithComments(this,sVar12);
        local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
        local_298.name._M_string_length = 0;
        local_298.name.field_2._M_local_buf[0] = '\0';
        local_298.current = 0;
        local_298.after = 1;
        local_298.position = sVar12;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_298);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        local_298.position = FindClosingChar(this,'{','}',sVar12,false,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_298.current = -1;
        local_298.after = -1;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
          operator_delete(local_298.name._M_dataplus._M_p);
        }
      }
      lVar15 = std::__cxx11::string::find((char *)psVar1,0x176523,lVar15 + 4);
    } while (lVar15 != -1);
  }
  uVar8 = std::__cxx11::string::find((char *)psVar1,0x176528,0);
  do {
    while( true ) {
      if (uVar8 == 0xffffffffffffffff) {
        AddIndent(this,"public:",-1,0);
        AddIndent(this,"private:",-1,0);
        AddIndent(this,"protected:",-1,0);
        AddIndent(this,"signals:",-1,0);
        AddIndent(this,"public slots:",-1,0);
        AddIndent(this,"private slots:",-1,0);
        AddIndent(this,"protected slots:",-1,0);
        AddIndent(this,"#include",-99999,0);
        AddIndent(this,"#if",-99999,0);
        AddIndent(this,"#elif",-99999,0);
        AddIndent(this,"#else",-99999,0);
        AddIndent(this,"#endif",-99999,0);
        AddIndent(this,"#define",-99999,0);
        AddIndent(this,"#undef",-99999,0);
        if (local_238 != (size_t *)0x0) {
          operator_delete(local_238);
        }
        if (local_258 != (size_t *)0x0) {
          operator_delete(local_258);
        }
        return true;
      }
      uVar17 = (int)uVar8 - 1;
      pcVar5 = (psVar1->_M_dataplus)._M_p;
      cVar3 = pcVar5[uVar17];
      if (((cVar3 == '\n') || (uVar17 == 0 || cVar3 == ' ')) &&
         ((uVar9 = (ulong)((int)uVar8 + 6), (this->m_BufferNoComment)._M_string_length <= uVar9 ||
          ((pcVar5[uVar9] & 0xf7U) == 0x20)))) break;
      uVar8 = std::__cxx11::string::find((char *)psVar1,0x176528,uVar8 + 1);
    }
    sVar12 = std::__cxx11::string::find((char *)psVar1,0x168cee,uVar8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    sVar13 = FindClosingChar(this,'{','}',sVar12,true,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_298.position = GetPositionWithComments(this,sVar13);
    local_298.name._M_string_length = 0;
    local_298.name.field_2._M_local_buf[0] = '\0';
    local_298.current = -1;
    local_298.after = -2;
    local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
    std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
              (this_00,&local_298);
    uVar9 = std::__cxx11::string::find((char *)psVar1,0x17652f,sVar12);
    if (sVar13 < uVar9) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar10 = std::__cxx11::string::find((char *)psVar1,0x176528,uVar8 + 1);
    local_260 = uVar8;
    for (; uVar10 != 0xffffffffffffffff;
        uVar10 = std::__cxx11::string::find((char *)psVar1,0x176528,uVar10 + 1)) {
      while( true ) {
        uVar17 = (int)uVar10 - 1;
        pcVar5 = (psVar1->_M_dataplus)._M_p;
        cVar3 = pcVar5[uVar17];
        if (((cVar3 == '\n') || (uVar17 == 0 || cVar3 == ' ')) &&
           ((uVar8 = (ulong)((int)uVar10 + 6), (this->m_BufferNoComment)._M_string_length <= uVar8
            || ((pcVar5[uVar8] & 0xf7U) == 0x20)))) break;
        uVar10 = std::__cxx11::string::find((char *)psVar1,0x176528,uVar10 + 1);
        if (uVar10 == 0xffffffffffffffff) goto LAB_0014f784;
      }
      if (uVar9 <= uVar10) goto LAB_0014f793;
      uVar9 = std::__cxx11::string::find((char *)psVar1,0x17652f,uVar9 + 1);
    }
LAB_0014f784:
    if (uVar9 != 0xffffffffffffffff) {
LAB_0014f793:
      local_220.position = GetPositionWithComments(this,uVar9);
      local_220.name._M_dataplus._M_p = (pointer)&local_220.name.field_2;
      local_220.name._M_string_length = 0;
      local_220.name.field_2._M_local_buf[0] = '\0';
      if (uVar9 != 0) {
        uVar8 = uVar9;
        do {
          uVar8 = uVar8 - 1;
          uVar10 = (ulong)(byte)(psVar1->_M_dataplus)._M_p[uVar8];
          if ((0x20 < uVar10) || ((0x100002400U >> (uVar10 & 0x3f) & 1) == 0)) goto LAB_0014f803;
        } while (uVar8 != 0);
      }
      uVar8 = 0xffffffffffffffff;
LAB_0014f803:
      local_220.current = -(uint)(uVar8 != sVar12);
      local_220.after = 0;
      std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
                (this_00,&local_220);
      sVar14 = std::__cxx11::string::find((char *)psVar1,0x176e43,uVar9 + 1);
      sVar14 = GetPositionWithComments(this,sVar14);
      pcVar5 = (this->m_Buffer)._M_dataplus._M_p;
      uVar8 = (this->m_Buffer)._M_string_length;
      uVar10 = sVar14 + 1;
      uVar9 = uVar10;
      if (uVar10 < uVar8) {
        do {
          uVar19 = (ulong)(byte)pcVar5[uVar10];
          uVar9 = uVar10;
          if ((0x20 < uVar19) || ((0x100002400U >> (uVar19 & 0x3f) & 1) == 0)) break;
          uVar10 = uVar10 + 1;
          uVar9 = uVar8;
        } while (uVar8 != uVar10);
      }
      if (pcVar5[uVar9] == '{') {
        local_1f0.name._M_dataplus._M_p = (pointer)&local_1f0.name.field_2;
        local_1f0.name._M_string_length = 0;
        local_1f0.name.field_2._M_local_buf[0] = '\0';
        local_1f0.current = 0;
        local_1f0.after = 0;
        local_1f0.position = uVar9;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_1f0);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
        local_1f0.position = FindClosingChar(this,'{','}',uVar9,false,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        local_1f0.current = 0;
        local_1f0.after = 0;
        std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
        push_back(this_00,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.name._M_dataplus._M_p != &local_1f0.name.field_2) {
          operator_delete(local_1f0.name._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.name._M_dataplus._M_p != &local_220.name.field_2) {
        operator_delete(local_220.name._M_dataplus._M_p);
      }
    }
    sVar14 = std::__cxx11::string::find((char *)psVar1,0x176537,sVar12);
    if (sVar14 < sVar13) {
      iVar21 = 1;
      sVar16 = sVar12;
      do {
        uVar8 = std::__cxx11::string::find((char *)psVar1,0x176528,sVar16);
        if (uVar8 < sVar14 && sVar12 < uVar8) {
          sVar14 = std::__cxx11::string::find((char *)psVar1,0x168cee,uVar8);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
          sVar14 = FindClosingChar(this,'{','}',sVar14,true,&local_90);
          _Var23._M_p = local_90._M_dataplus._M_p;
          sVar16 = sVar14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0014fa6b:
            operator_delete(_Var23._M_p);
            sVar16 = sVar14;
          }
        }
        else {
          local_220.position = GetPositionWithComments(this,sVar14);
          local_220.name._M_dataplus._M_p = (pointer)&local_220.name.field_2;
          local_220.name._M_string_length = 0;
          local_220.name.field_2._M_local_buf[0] = '\0';
          local_220.after = 0;
          local_220.current = iVar21 + -1;
          std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
          push_back(this_00,&local_220);
          sVar16 = std::__cxx11::string::find(cVar22,0x3a);
          uVar8 = sVar16 + 1;
          if (uVar8 < (this->m_BufferNoComment)._M_string_length) {
            do {
              if ((psVar1->_M_dataplus)._M_p[uVar8] != ':') break;
              sVar16 = std::__cxx11::string::find(cVar22,0x3a);
              uVar8 = sVar16 + 1;
            } while (uVar8 < (this->m_BufferNoComment)._M_string_length);
          }
          if (sVar16 != 0xffffffffffffffff) {
            sVar16 = GetPositionWithComments(this,sVar16);
            local_1f0.name._M_dataplus._M_p = (pointer)&local_1f0.name.field_2;
            local_1f0.name._M_string_length = 0;
            local_1f0.name.field_2._M_local_buf[0] = '\0';
            local_1f0.after = iVar21;
            local_1f0.current = iVar21 + -1;
            local_1f0.position = sVar16;
            std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
            push_back(this_00,&local_1f0);
            pcVar5 = (this->m_Buffer)._M_dataplus._M_p;
            uVar8 = (this->m_Buffer)._M_string_length;
            uVar10 = sVar16 + 1;
            uVar9 = uVar10;
            if (uVar10 < uVar8) {
              do {
                uVar19 = (ulong)(byte)pcVar5[uVar10];
                uVar9 = uVar10;
                if ((0x20 < uVar19) || ((0x100002400U >> (uVar19 & 0x3f) & 1) == 0)) break;
                uVar10 = uVar10 + 1;
                uVar9 = uVar8;
              } while (uVar8 != uVar10);
            }
            if (pcVar5[uVar9] == '{') {
              local_1c0.name._M_dataplus._M_p = (pointer)&local_1c0.name.field_2;
              local_1c0.name._M_string_length = 0;
              local_1c0.name.field_2._M_local_buf[0] = '\0';
              local_1c0.current = 0;
              local_1c0.after = 0;
              local_1c0.position = uVar9;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back(this_00,&local_1c0);
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
              local_1c0.position = FindClosingChar(this,'{','}',uVar9,false,&local_190);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              local_1c0.current = 0;
              local_1c0.after = 0;
              std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::
              push_back(this_00,&local_1c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0.name._M_dataplus._M_p != &local_1c0.name.field_2) {
                operator_delete(local_1c0.name._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0.name._M_dataplus._M_p != &local_1f0.name.field_2) {
              operator_delete(local_1f0.name._M_dataplus._M_p);
            }
          }
          _Var23._M_p = local_220.name._M_dataplus._M_p;
          sVar16 = sVar14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.name._M_dataplus._M_p != &local_220.name.field_2) goto LAB_0014fa6b;
        }
        sVar14 = std::__cxx11::string::find((char *)psVar1,0x176537,sVar16 + 1);
        iVar21 = 0;
      } while (sVar14 < sVar13);
    }
    uVar8 = std::__cxx11::string::find((char *)psVar1,0x176528,local_260 + 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
      operator_delete(local_298.name._M_dataplus._M_p);
    }
  } while( true );
joined_r0x0014ef34:
  if (sVar12 == 0xffffffffffffffff) goto LAB_0014f3cb;
LAB_0014ef40:
  uVar8 = std::__cxx11::string::find(cVar22,0x7b);
  local_264 = 0;
  if (uVar8 < sVar12) {
    local_264 = 0;
    do {
      sVar13 = GetPositionWithComments(this,uVar8);
      for (ppVar18 = (this->m_IfElseEndifList).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar18 !=
          (this->m_IfElseEndifList).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar18 = ppVar18 + 1) {
        if ((ppVar18->first < sVar13) && (sVar13 < ppVar18->second)) goto LAB_0014f05d;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
      bVar7 = IsBetweenQuote(this,uVar8,false,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (!bVar7) {
        if (local_238 == iStack_230._M_current) {
          uVar17 = 1;
        }
        else {
          bVar20 = 0;
          psVar24 = local_238;
          do {
            sVar13 = *psVar24;
            sVar14 = GetPositionWithComments(this,uVar8);
            if (sVar13 == sVar14) {
              bVar20 = 1;
            }
            psVar24 = psVar24 + 1;
          } while (psVar24 != iStack_230._M_current);
          uVar17 = (uint)(~bVar20 & 1);
        }
        local_264 = local_264 + uVar17;
      }
LAB_0014f05d:
      uVar8 = std::__cxx11::string::find(cVar22,0x7b);
    } while (uVar8 < sVar12);
  }
  local_260 = 0;
  uVar8 = std::__cxx11::string::find(cVar22,0x7d);
  if (uVar8 < sVar12) {
    local_260 = 0;
    do {
      sVar13 = GetPositionWithComments(this,uVar8);
      for (ppVar18 = (this->m_IfElseEndifList).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar18 !=
          (this->m_IfElseEndifList).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar18 = ppVar18 + 1) {
        if ((ppVar18->first < sVar13) && (sVar13 < ppVar18->second)) goto LAB_0014f19b;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      bVar7 = IsBetweenQuote(this,uVar8,false,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (!bVar7) {
        if (local_238 == iStack_230._M_current) {
          uVar17 = 1;
        }
        else {
          bVar20 = 0;
          psVar24 = local_238;
          do {
            sVar13 = *psVar24;
            sVar14 = GetPositionWithComments(this,uVar8);
            if (sVar13 == sVar14) {
              bVar20 = 1;
            }
            psVar24 = psVar24 + 1;
          } while (psVar24 != iStack_230._M_current);
          uVar17 = (uint)(~bVar20 & 1);
        }
        local_260 = (ulong)((int)local_260 + uVar17);
      }
LAB_0014f19b:
      uVar8 = std::__cxx11::string::find(cVar22,0x7d);
    } while (uVar8 < sVar12);
  }
  psVar24 = local_258;
  if ((int)local_260 == local_264) {
    for (; psVar24 != iStack_250._M_current; psVar24 = psVar24 + 1) {
      sVar13 = *psVar24;
      sVar14 = GetPositionWithComments(this,sVar12);
      if (sVar13 == sVar14) goto LAB_0014f3a9;
    }
    sVar12 = GetPositionWithComments(this,sVar12);
    paVar2 = &local_298.name.field_2;
    local_298.name._M_string_length = 0;
    local_298.name.field_2._M_local_buf[0] = '\0';
    local_298.current = 0;
    local_298.after = 1;
    local_298.position = sVar12;
    local_298.name._M_dataplus._M_p = (pointer)paVar2;
    std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
              (this_00,&local_298);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    local_298.position = FindClosingChar(this,'{','}',sVar12,false,&local_110);
    psVar6 = &local_110;
    _Var23._M_p = local_110._M_dataplus._M_p;
    while( true ) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var23._M_p != &psVar6->field_2) {
        operator_delete(_Var23._M_p);
      }
      sVar12 = local_298.position;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
      bVar7 = IsBetweenQuote(this,sVar12,true,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      sVar12 = local_298.position;
      if (!bVar7) break;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      local_298.position = FindClosingChar(this,'{','}',sVar12 + 1,false,&local_150);
      psVar6 = &local_150;
      _Var23._M_p = local_150._M_dataplus._M_p;
    }
    local_298.current = -1;
    local_298.after = -1;
    std::vector<kws::IndentPositionStruct,_std::allocator<kws::IndentPositionStruct>_>::push_back
              (this_00,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_298.name._M_dataplus._M_p);
    }
  }
LAB_0014f3a9:
  sVar12 = std::__cxx11::string::find(cVar22,0x7b);
  goto joined_r0x0014ef34;
}

Assistant:

bool Parser::InitIndentation()
{
  m_IdentPositionVector.clear();

  // namespace
  std::vector<size_t> namespacevec;

  size_t posNamespace = m_BufferNoComment.find("namespace",0);
  while(posNamespace!=std::string::npos)
    {
    size_t posNamespace1 = m_BufferNoComment.find("{",posNamespace);
    if(posNamespace1 != std::string::npos)
      {
      size_t posNamespace2 = m_BufferNoComment.find(";",posNamespace);
      if((posNamespace2 == std::string::npos) || (posNamespace2 > posNamespace1))
        {
        size_t posNamespaceComments = this->GetPositionWithComments(posNamespace1);
        IndentPosition ind;
        ind.position = posNamespaceComments;
        ind.current = 0;
        ind.after = 0;
        namespacevec.push_back(posNamespaceComments);
        //std::cout << "Found Namespace at: " << this->GetLineNumber(posNamespaceComments) << std::endl;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posNamespaceComments);
        namespacevec.push_back(ind.position);
        m_IdentPositionVector.push_back(ind);
        }
      }
    posNamespace = m_BufferNoComment.find("namespace",posNamespace+1);
    }

  // Create a list of position specific for namespaces
  std::vector<size_t> namespacePos;
  auto itIdentPos = m_IdentPositionVector.begin();
  while(itIdentPos != m_IdentPositionVector.end())
    {
    namespacePos.push_back((*itIdentPos).position);
    itIdentPos++;
    }

  // Check if the { is the first in the file/function or in a namespace
  size_t posClass = m_BufferNoComment.find('{',0);

  while(posClass!= std::string::npos && this->IsInElseForbiddenSection(this->GetPositionWithComments(posClass)))
    {
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  while(posClass != std::string::npos)
    {
    // We count the number of { and } before posClass
    unsigned int nOpen = 0;
    unsigned int nClose = 0;

    size_t open = m_BufferNoComment.find('{',0);
    while(open!=std::string::npos && open<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(open))
        && !this->IsBetweenQuote(open)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(open))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nOpen++;
          }
        }
      open = m_BufferNoComment.find('{',open+1);
      }

    size_t close = m_BufferNoComment.find('}',0);
    while(close!=std::string::npos && close<posClass)
      {
      if(!this->IsInElseForbiddenSection(this->GetPositionWithComments(close))
        && !this->IsBetweenQuote(close)
        )
        {
        bool isNamespace = false;
        // Remove the potential namespaces
        std::vector<size_t>::const_iterator itN = namespacePos.begin();
        while(itN != namespacePos.end())
          {
          if((*itN)==this->GetPositionWithComments(close))
            {
            isNamespace = true;
            }
          itN++;
          }
        if(!isNamespace)
          {
          nClose++;
          }
        }
      close = m_BufferNoComment.find('}',close+1);
      }

    bool defined = false;

    if(nClose == nOpen)
      {
      // Check if this is not the namespace previously defined
      auto itname = namespacevec.begin();
      while(itname != namespacevec.end())
        {
        if((*itname) == this->GetPositionWithComments(posClass))
          {
          defined = true;
          break;
          }
        itname++;
        }
      }

    if((nClose == nOpen) && !defined)
      {
      // translate the position in the buffer position;
      size_t posClassComments = this->GetPositionWithComments(posClass);
      IndentPosition ind;
      ind.position = posClassComments;
      ind.current = 0;
      ind.after = 1;
      m_IdentPositionVector.push_back(ind);
      ind.position = this->FindClosingChar('{','}',posClassComments);
      while(this->IsBetweenQuote(ind.position,true))
        {
        ind.position = this->FindClosingChar('{','}',ind.position+1);
        }
      ind.current = -1;
      ind.after = -1;
      m_IdentPositionVector.push_back(ind);
      }
    posClass = m_BufferNoComment.find('{',posClass+1);
    }

  // int main()
  size_t posMain = m_BufferNoComment.find("main",0);
  while(posMain != std::string::npos)
    {
    // Check if the next char is '('
    bool valid = true;
    auto pos = static_cast<unsigned long>(posMain + 5);
    while(pos<m_BufferNoComment.size()
         && (m_BufferNoComment[pos]==' '
         || m_BufferNoComment[pos]=='\r'
         || m_BufferNoComment[pos]=='\n')
         )
      {
      pos++;
      }

    if(m_BufferNoComment[pos]!='(')
      {
      valid = false;
      }
    if(valid)
      {
      size_t bracket = m_BufferNoComment.find('{',posMain+4);
      if(bracket != std::string::npos)
        {
        // translate the position in the buffer position;
        size_t posMainComments = this->GetPositionWithComments(bracket);
        IndentPosition ind;
        ind.position = posMainComments;
        ind.current = 0;
        ind.after = 1;
        m_IdentPositionVector.push_back(ind);
        ind.position = this->FindClosingChar('{','}',posMainComments);
        ind.current = -1;
        ind.after = -1;
        m_IdentPositionVector.push_back(ind);
        }
      }
    posMain = m_BufferNoComment.find("main",posMain+4);
    }

  // switch/case statement
  // for the moment break; restore the indentation
  size_t posSwitch = m_BufferNoComment.find("switch",0);
  while(posSwitch != std::string::npos)
    {
    // Check that it is a valid switch statement
    if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(posSwitch)))
     {
     posSwitch = m_BufferNoComment.find("switch",posSwitch+1);
     continue;
     }

    // If this is the first case we find the openning { in order to
    // find the closing } of the switch statement
    size_t openningBracket = m_BufferNoComment.find("{",posSwitch);
    size_t closingBracket = this->FindClosingChar('{','}',openningBracket,true);
    size_t posColumnComments = this->GetPositionWithComments(closingBracket);
    IndentPosition ind;
    ind.position = posColumnComments;
    ind.current = -1;
    ind.after = -2;
    m_IdentPositionVector.push_back(ind);

    // Do the default case
    size_t defaultPos = m_BufferNoComment.find("default",openningBracket);
    if(defaultPos > closingBracket)
      {
      defaultPos = std::string::npos;
      }

    // We need to make sure that there is no "switch" statement nested
    size_t nestedSwitch = m_BufferNoComment.find("switch",posSwitch+1);
    while(nestedSwitch != std::string::npos)
      {
        if(!this->CheckValidSwitchStatement(static_cast<unsigned int>(nestedSwitch)))
        {
        nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
        continue;
        }

      if(nestedSwitch < defaultPos)
        {
        defaultPos = m_BufferNoComment.find("default",defaultPos+1);
        }
      else
        {
        break;
        }
      nestedSwitch = m_BufferNoComment.find("switch",nestedSwitch+1);
      }

    if(defaultPos != std::string::npos)
      {
      size_t localposColumnComments = this->GetPositionWithComments(defaultPos);
      IndentPosition localind;
      localind.position = localposColumnComments;

      // The current indent should be -1 unless we are right after the openning
      // bracket. In that case the current indent should be 0;
      size_t j=defaultPos-1;
      while(j!=std::string::npos)
        {
        if(m_BufferNoComment[j] != ' '
          && m_BufferNoComment[j] != '\n'
          && m_BufferNoComment[j] != '\r'
          )
          {
          break;
          }
        j--;
        }

      if(j == openningBracket)
        {
        localind.current = 0;
        }
      else
        {
        localind.current = -1;
        }

      localind.after = 0;
      m_IdentPositionVector.push_back(localind);
      // Find the ':' after the default
      size_t column = m_BufferNoComment.find(":",defaultPos+1);
      column = this->GetPositionWithComments(column);

      // Sometimes there is a { right after the : we skip it if this is
      // the case
      size_t ic = column+1;
      while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
        {
        ic++;
        }
      if(m_Buffer[ic] == '{')
        {
        IndentPosition tempind;
        tempind.position = ic;
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        tempind.position = this->FindClosingChar('{','}',ic);
        tempind.current = 0;
        tempind.after = 0;
        m_IdentPositionVector.push_back(tempind);
        }
      }

    size_t posCase = m_BufferNoComment.find("case",openningBracket);
    bool firstCase = true;
    size_t previousCase = openningBracket;

    while(posCase!= std::string::npos && posCase<closingBracket)
      {
      // Check if we don't have any switch statement inside
      size_t insideSwitch = m_BufferNoComment.find("switch",previousCase);
      if(insideSwitch>openningBracket && insideSwitch<posCase)
        {
        // jump to the end of the inside switch/case
        size_t insideBracket = m_BufferNoComment.find("{",insideSwitch);
        posCase = this->FindClosingChar('{','}',insideBracket,true);
        }
      else
        {
        size_t localposColumnComments = this->GetPositionWithComments(posCase);
        IndentPosition localindtemp;
        localindtemp.position = localposColumnComments;
        if(firstCase)
          {
          localindtemp.current = 0;
          }
        else
          {
          localindtemp.current = -1;
          }
        localindtemp.after = 0;

        m_IdentPositionVector.push_back(localindtemp);

        size_t column = m_BufferNoComment.find(':',posCase+3);
        // Make sure that we are not checing '::'
        while(column+1<m_BufferNoComment.size()
          && m_BufferNoComment[column+1]==':')
          {
          column = m_BufferNoComment.find(':',column+2);
          }

        if(column != std::string::npos)
          {
          // translate the position in the buffer position;
          localposColumnComments = this->GetPositionWithComments(column);
          IndentPosition localind;
          localind.position = localposColumnComments;
          if(firstCase)
            {
            localind.current = 0;
            localind.after = 1;
            }
          else
            {
            localind.current = -1;
            localind.after = 0;
            }
          m_IdentPositionVector.push_back(localind);

          // Sometimes there is a { right after the : we skip it if this is
          // the case
          size_t ic = localposColumnComments+1;
          while(ic<m_Buffer.size()
            && (m_Buffer[ic] == ' '
            || m_Buffer[ic] == '\r'
            || m_Buffer[ic] == '\n'))
            {
            ic++;
            }
          if(m_Buffer[ic] == '{')
            {
            IndentPosition tempind;
            tempind.position = ic;
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            tempind.position = this->FindClosingChar('{','}',ic);
            tempind.current = 0;
            tempind.after = 0;
            m_IdentPositionVector.push_back(tempind);
            }
          }
        }
      firstCase = false;
      previousCase = posCase;
      posCase = m_BufferNoComment.find("case",posCase+1);
      }

    posSwitch = m_BufferNoComment.find("switch",posSwitch+3);
    }

  // Some words should be indented as the previous indent
  this->AddIndent("public:",-1,0);
  this->AddIndent("private:",-1,0);
  this->AddIndent("protected:",-1,0);
  this->AddIndent("signals:",-1,0);
  this->AddIndent("public slots:",-1,0);
  this->AddIndent("private slots:",-1,0);
  this->AddIndent("protected slots:",-1,0);

  // some words should be always align left
  this->AddIndent("#include",ALIGN_LEFT,0);
  this->AddIndent("#if",ALIGN_LEFT,0);
  //this->AddIndent("#ifdef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#elif",ALIGN_LEFT,0);
  this->AddIndent("#else",ALIGN_LEFT,0);
  this->AddIndent("#endif",ALIGN_LEFT,0);
  //this->AddIndent("#ifndef",ALIGN_LEFT,0); // #if is taking care of it
  this->AddIndent("#define",ALIGN_LEFT,0);
  this->AddIndent("#undef",ALIGN_LEFT,0);

  return true;
}